

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O1

void GPU_MatrixScale(float *result,float sx,float sy,float sz)

{
  float temp [16];
  float local_98 [6];
  undefined8 local_80;
  undefined8 uStack_78;
  float local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (result != (float *)0x0) {
    local_98[1] = 0.0;
    local_98[2] = 0.0;
    local_98[3] = 0.0;
    local_98[4] = 0.0;
    local_80 = 0;
    uStack_78 = 0;
    local_6c = 0;
    uStack_64 = 0;
    local_5c = 0x3f800000;
    local_98[0] = sx;
    local_98[5] = sy;
    local_70 = sz;
    GPU_MatrixMultiply((float *)&local_58,result,local_98);
    *(undefined8 *)(result + 0xc) = local_28;
    *(undefined8 *)(result + 0xe) = uStack_20;
    *(undefined8 *)(result + 8) = local_38;
    *(undefined8 *)(result + 10) = uStack_30;
    *(undefined8 *)(result + 4) = local_48;
    *(undefined8 *)(result + 6) = uStack_40;
    *(undefined8 *)result = local_58;
    *(undefined8 *)(result + 2) = uStack_50;
  }
  return;
}

Assistant:

void GPU_MatrixScale(float* result, float sx, float sy, float sz)
{
    if(result == NULL)
		return;

	{
		float A[16];
		FILL_MATRIX_4x4(A,
				sx, 0, 0, 0,
				0, sy, 0, 0,
				0, 0, sz, 0,
				0, 0, 0, 1
			);

		GPU_MultiplyAndAssign(result, A);
	}
}